

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

bool __thiscall cmCTest::AddIfExists(cmCTest *this,Part part,string *file)

{
  bool bVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string name;
  string local_60;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  undefined8 local_30;
  char *local_28;
  
  bVar1 = CTestFileExists(this,file);
  if (bVar1) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               ((long)((this->Impl)._M_t.
                       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                       .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->Parts +
               (ulong)part * 0x40),file);
  }
  else {
    local_40._M_str = (file->_M_dataplus)._M_p;
    local_40._M_len = file->_M_string_length;
    local_30 = 3;
    local_28 = ".gz";
    views._M_len = 2;
    views._M_array = &local_40;
    cmCatViews_abi_cxx11_(&local_60,views);
    bVar1 = CTestFileExists(this,&local_60);
    if (bVar1) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 ((long)((this->Impl)._M_t.
                         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                         .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->Parts +
                 (ulong)part * 0x40),file);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool cmCTest::AddIfExists(Part part, const std::string& file)
{
  if (this->CTestFileExists(file)) {
    this->AddSubmitFile(part, file);
  } else {
    std::string name = cmStrCat(file, ".gz");
    if (this->CTestFileExists(name)) {
      this->AddSubmitFile(part, file);
    } else {
      return false;
    }
  }
  return true;
}